

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack10_24(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  uint32_t uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar16 [32];
  undefined1 auVar15 [32];
  
  uVar1 = *(ulong *)(in + 1);
  auVar12 = vpmovsxbd_avx2(ZEXT816(0x1010000000a0908));
  uVar2 = in[4];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar1;
  auVar10 = vpsllvd_avx2(auVar11,_DAT_00196cd0);
  auVar9._8_4_ = 0x3fc;
  auVar9._0_8_ = 0x3f0000003fc;
  auVar9._12_4_ = 0x3f0;
  auVar9 = vpandq_avx512vl(auVar10,auVar9);
  auVar10 = vpbroadcastd_avx512vl();
  *out = *in & 0x3ff;
  uVar3 = in[3];
  auVar12 = vpermi2d_avx512vl(auVar12,ZEXT832(uVar1),ZEXT1632(auVar10));
  auVar5 = vpmovsxbd_avx2(ZEXT816(0x10061c12081e140a));
  auVar10 = vpshufd_avx(auVar11,0x55);
  uVar13 = auVar9._0_8_;
  auVar16._8_8_ = uVar13;
  auVar16._0_8_ = uVar13;
  auVar16._16_8_ = uVar13;
  auVar16._24_8_ = uVar13;
  auVar14._8_4_ = 0x3ff;
  auVar14._0_8_ = 0x3ff000003ff;
  auVar14._12_4_ = 0x3ff;
  auVar15._16_4_ = 0x3ff;
  auVar15._0_16_ = auVar14;
  auVar15._20_4_ = 0x3ff;
  auVar15._24_4_ = 0x3ff;
  auVar15._28_4_ = 0x3ff;
  auVar10 = vpinsrd_avx(auVar10,uVar3,1);
  auVar7 = vpsrlvd_avx2(auVar12,auVar5);
  auVar12 = vpand_avx2(auVar7,auVar15);
  auVar7 = vpor_avx2(auVar7,auVar16);
  auVar12 = vpblendd_avx2(auVar12,auVar7,0x24);
  auVar9 = vpinsrd_avx(auVar14,(uVar3 & 0xf) << 6,0);
  *(undefined1 (*) [32])(out + 1) = auVar12;
  auVar11 = vpbroadcastd_avx512vl();
  auVar11 = vpsrlvd_avx2(auVar11,_DAT_00196550);
  auVar9 = vpinsrd_avx(auVar9,uVar3 >> 0x18,3);
  uVar1 = *(ulong *)(in + 5);
  auVar11 = vpinsrd_avx(auVar11,uVar2,2);
  auVar10 = vpinsrd_avx(auVar10,uVar2 << 8,3);
  uVar8 = (uint)(uVar1 >> 0x20);
  auVar4 = vpshufd_avx(auVar10,0xd4);
  auVar6 = vpsrlvd_avx2(auVar4,_DAT_001a0ea0);
  auVar4._8_4_ = 0x300;
  auVar4._0_8_ = 0x30000000300;
  auVar4._12_4_ = 0x300;
  auVar10 = vpandd_avx512vl(auVar10,auVar4);
  auVar4 = vpblendd_avx2(auVar6,auVar10,8);
  auVar10 = vpand_avx(auVar6,auVar14);
  auVar9 = vpor_avx(auVar4,auVar9);
  auVar10 = vpblendd_avx2(auVar9,auVar10,6);
  *(undefined1 (*) [16])(out + 9) = auVar10;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar1;
  auVar9 = vpshufd_avx(auVar10,0x40);
  auVar10 = vinsertps_avx(auVar11,auVar10,0x34);
  auVar11 = vpsrld_avx(auVar11,0x16);
  auVar10 = vandps_avx(auVar10,auVar14);
  auVar4 = vpsrlvd_avx2(auVar9,auVar5._0_16_);
  auVar10 = vblendps_avx(auVar10,auVar11,4);
  auVar11 = vpinsrd_avx(auVar14,(uVar8 & 0xff) << 2,2);
  uVar3 = in[7];
  auVar9 = vpand_avx(auVar4,auVar14);
  auVar11 = vpor_avx(auVar4,auVar11);
  *(undefined1 (*) [16])(out + 0xd) = auVar10;
  auVar10 = vpblendd_avx2(auVar9,auVar11,4);
  *(undefined1 (*) [16])(out + 0x11) = auVar10;
  out[0x15] = uVar8 >> 0x12 & 0x3ff;
  out[0x16] = uVar8 >> 0x1c | (uVar3 & 0x3f) << 4;
  out[0x17] = uVar3 >> 6 & 0x3ff;
  return in + 8;
}

Assistant:

const uint32_t *__fastunpack10_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 10);
  out++;
  *out = ((*in) >> 10) % (1U << 10);
  out++;
  *out = ((*in) >> 20) % (1U << 10);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 8)) << (10 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 10);
  out++;
  *out = ((*in) >> 18) % (1U << 10);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 6)) << (10 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 10);
  out++;
  *out = ((*in) >> 16) % (1U << 10);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 4)) << (10 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 10);
  out++;
  *out = ((*in) >> 14) % (1U << 10);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 2)) << (10 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 10);
  out++;
  *out = ((*in) >> 12) % (1U << 10);
  out++;
  *out = ((*in) >> 22);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 10);
  out++;
  *out = ((*in) >> 10) % (1U << 10);
  out++;
  *out = ((*in) >> 20) % (1U << 10);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 8)) << (10 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 10);
  out++;
  *out = ((*in) >> 18) % (1U << 10);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 6)) << (10 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 10);
  out++;

  return in + 1;
}